

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O0

void __thiscall
SolverAppTest_ParseOptions_Test::~SolverAppTest_ParseOptions_Test
          (SolverAppTest_ParseOptions_Test *this)

{
  void *in_RDI;
  
  ~SolverAppTest_ParseOptions_Test((SolverAppTest_ParseOptions_Test *)0x165438);
  operator_delete(in_RDI,0x5f8);
  return;
}

Assistant:

TEST_F(SolverAppTest, ParseOptions) {
  AddOption();
  RedirectOutput();
  EXPECT_CALL(handler_, OnOption()).WillOnce(Return(true));
  EXPECT_EQ(0, app_.Run(Args("test", "-w")));
}